

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::buildPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          SimpleGraphicsPipelineBuilder *this,UVec2 *renderSize,VkRenderPass renderPass,
          VkPipelineCache cache,VkPipelineLayout pipelineLayout)

{
  DeviceInterface *vk;
  VkDevice device;
  uint uVar1;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkRect2D scissor;
  VkPipelineTessellationStateCreateInfo tessStateCreateInfo;
  VkViewport viewport;
  VkPipelineColorBlendAttachmentState colorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkPipelineRasterizationStateCreateInfo rasterStateParams;
  VkPipelineDepthStencilStateCreateInfo depthStencilStateParams;
  VkGraphicsPipelineCreateInfo graphicsPipelineParams;
  VkVertexInputBindingDescription local_2e8;
  VkRect2D local_2d8;
  VkPipelineTessellationStateCreateInfo local_2c8;
  VkViewport local_2b0;
  VkPipelineColorBlendAttachmentState local_298;
  VkPipelineInputAssemblyStateCreateInfo local_278;
  VkVertexInputAttributeDescription local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  VkPipelineMultisampleStateCreateInfo local_238;
  VkPipelineViewportStateCreateInfo local_200;
  VkPipelineVertexInputStateCreateInfo local_1d0;
  VkPipelineColorBlendStateCreateInfo local_1a0;
  VkPipelineRasterizationStateCreateInfo local_168;
  VkPipelineDepthStencilStateCreateInfo local_128;
  VkGraphicsPipelineCreateInfo local_c0;
  
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  local_1d0.pVertexBindingDescriptions = &local_2e8;
  local_2e8.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_2e8.binding = 0;
  local_2e8.stride = 0x20;
  local_1d0.pVertexAttributeDescriptions = &local_258;
  local_248 = 1;
  uStack_240 = 0x100000006d;
  local_258.location = 0;
  local_258.binding = 0;
  local_258.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_258.offset = 0;
  local_c0.pVertexInputState = &local_1d0;
  local_1d0.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_1d0.pNext = (void *)0x0;
  local_1d0.flags = 0;
  local_1d0.vertexBindingDescriptionCount = 1;
  local_1d0.vertexAttributeDescriptionCount = 2;
  local_c0.pInputAssemblyState = &local_278;
  local_278.pNext = (void *)0x0;
  local_278.primitiveRestartEnable = 0;
  local_278._28_4_ = 0;
  local_278.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_278._4_4_ = 0;
  local_2c8.patchControlPoints = this->m_patchControlPoints;
  uVar1 = 10;
  if (local_2c8.patchControlPoints == 0) {
    uVar1 = 3;
  }
  local_278._16_8_ = (ulong)uVar1 << 0x20;
  local_200.pViewports = &local_2b0;
  local_2b0.x = 0.0;
  local_2b0.y = 0.0;
  local_2d8.extent.width = renderSize->m_data[0];
  local_2b0.width = (float)local_2d8.extent.width;
  local_2d8.extent.height = renderSize->m_data[1];
  local_2b0.height = (float)local_2d8.extent.height;
  local_2b0.minDepth = 0.0;
  local_2b0.maxDepth = 1.0;
  local_200.pScissors = &local_2d8;
  local_2d8.offset.x = 0;
  local_2d8.offset.y = 0;
  local_c0.pViewportState = &local_200;
  local_200.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_200.pNext = (void *)0x0;
  local_200.flags = 0;
  local_200.viewportCount = 1;
  local_200.scissorCount = 1;
  local_c0.pRasterizationState = &local_168;
  local_168.pNext = (void *)0x0;
  local_168.depthBiasClamp = 0.0;
  local_168.depthBiasSlopeFactor = 0.0;
  local_168.cullMode = 0;
  local_168.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  local_168.depthBiasEnable = 0;
  local_168.depthBiasConstantFactor = 0.0;
  local_168.flags = 0;
  local_168.depthClampEnable = 0;
  local_168.rasterizerDiscardEnable = 0;
  local_168.polygonMode = VK_POLYGON_MODE_FILL;
  local_168.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_168._4_4_ = 0;
  local_168.lineWidth = 1.0;
  local_168._60_4_ = 0;
  local_1a0.pAttachments = &local_298;
  local_298.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_298.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_298.alphaBlendOp = VK_BLEND_OP_ADD;
  local_298.colorWriteMask = 0xf;
  local_298.blendEnable = 0;
  local_298.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_298.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_298.colorBlendOp = VK_BLEND_OP_ADD;
  local_c0.pColorBlendState = &local_1a0;
  local_1a0.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_1a0.pNext = (void *)0x0;
  local_1a0.flags = 0;
  local_1a0.logicOpEnable = 0;
  local_1a0.logicOp = VK_LOGIC_OP_COPY;
  local_1a0.attachmentCount = 1;
  local_1a0.blendConstants[0] = 0.0;
  local_1a0.blendConstants[1] = 0.0;
  local_1a0.blendConstants[2] = 0.0;
  local_1a0.blendConstants[3] = 0.0;
  local_c0.pMultisampleState = &local_238;
  local_238.pNext = (void *)0x0;
  local_238.sampleShadingEnable = 0;
  local_238.minSampleShading = 0.0;
  local_238.pSampleMask = (VkSampleMask *)0x0;
  local_238.alphaToCoverageEnable = 0;
  local_238.alphaToOneEnable = 0;
  local_238.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_238._4_4_ = 0;
  local_238.flags = 0;
  local_238.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_c0.pDepthStencilState = &local_128;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.back.compareOp = VK_COMPARE_OP_NEVER;
  local_128.back.compareMask = 0;
  local_128.back.writeMask = 0;
  local_128.back.reference = 0;
  local_128.front.reference = 0;
  local_128.back.failOp = VK_STENCIL_OP_KEEP;
  local_128.back.passOp = VK_STENCIL_OP_KEEP;
  local_128.back.depthFailOp = VK_STENCIL_OP_KEEP;
  local_128.front.depthFailOp = VK_STENCIL_OP_KEEP;
  local_128.front.compareOp = VK_COMPARE_OP_NEVER;
  local_128.front.compareMask = 0;
  local_128.front.writeMask = 0;
  local_128.depthBoundsTestEnable = 0;
  local_128.stencilTestEnable = 0;
  local_128.front.failOp = VK_STENCIL_OP_KEEP;
  local_128.front.passOp = VK_STENCIL_OP_KEEP;
  local_128.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_128._4_4_ = 0;
  local_128.depthTestEnable = 1;
  local_128.depthWriteEnable = 1;
  local_128.depthCompareOp = VK_COMPARE_OP_LESS_OR_EQUAL;
  local_128.minDepthBounds = 0.0;
  local_128.maxDepthBounds = 1.0;
  local_2c8.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_2c8.pNext = (void *)0x0;
  local_2c8.flags = 0;
  local_c0.pTessellationState = &local_2c8;
  if (local_2c8.patchControlPoints == 0) {
    local_c0.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  local_c0.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_c0.pNext = (void *)0x0;
  local_c0.flags = 0;
  local_c0.stageCount = this->m_shaderStageCount;
  local_c0.pStages = this->m_shaderStageInfo;
  local_c0.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_c0.subpass = 0;
  local_c0.basePipelineHandle.m_internal = 0;
  local_c0.basePipelineIndex = 0;
  local_c0.layout.m_internal = pipelineLayout.m_internal;
  local_c0.renderPass.m_internal = renderPass.m_internal;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device,cache,&local_c0,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> SimpleGraphicsPipelineBuilder::buildPipeline (tcu::UVec2 renderSize, VkRenderPass renderPass, VkPipelineCache cache, VkPipelineLayout pipelineLayout)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();
	const VkDevice              vkDevice            = m_context.getDevice();

	// Create pipeline
	const VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0u,                                 // deUint32                 binding;
		sizeof(Vertex4RGBA),                // deUint32                 strideInBytes;
		VK_VERTEX_INPUT_RATE_VERTEX,        // VkVertexInputRate        inputRate;
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
	{
		{
			0u,                                 // deUint32 location;
			0u,                                 // deUint32 binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,      // VkFormat format;
			0u                                  // deUint32 offsetInBytes;
		},
		{
			1u,                                 // deUint32 location;
			0u,                                 // deUint32 binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,      // VkFormat format;
			DE_OFFSET_OF(Vertex4RGBA, color),   // deUint32 offsetInBytes;
		}
	};

	const VkPipelineVertexInputStateCreateInfo vertexInputStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,      // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineVertexInputStateCreateFlags    flags;
		1u,                                                             // deUint32                                 vertexBindingDescriptionCount;
		&vertexInputBindingDescription,                                 // const VkVertexInputBindingDescription*   pVertexBindingDescriptions;
		2u,                                                             // deUint32                                 vertexAttributeDescriptionCount;
		vertexInputAttributeDescriptions,                               // const VkVertexInputAttributeDescription* pVertexAttributeDescriptions;
	};

	const VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,    // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineInputAssemblyStateCreateFlags  flags;
		(m_patchControlPoints == 0 ? VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST
								   : VK_PRIMITIVE_TOPOLOGY_PATCH_LIST), // VkPrimitiveTopology                      topology;
		VK_FALSE,                                                       // VkBool32                                 primitiveRestartEnable;
	};

	const VkViewport viewport =
	{
		0.0f,                       // float    originX;
		0.0f,                       // float    originY;
		(float)renderSize.x(),      // float    width;
		(float)renderSize.y(),      // float    height;
		0.0f,                       // float    minDepth;
		1.0f                        // float    maxDepth;
	};
	const VkRect2D scissor =
	{
		{ 0, 0 },                                                       // VkOffset2D  offset;
		{ renderSize.x(), renderSize.y() }                              // VkExtent2D  extent;
	};
	const VkPipelineViewportStateCreateInfo viewportStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,          // VkStructureType                      sType;
		DE_NULL,                                                        // const void*                          pNext;
		0u,                                                             // VkPipelineViewportStateCreateFlags   flags;
		1u,                                                             // deUint32                             viewportCount;
		&viewport,                                                      // const VkViewport*                    pViewports;
		1u,                                                             // deUint32                             scissorCount;
		&scissor                                                        // const VkRect2D*                      pScissors;
	};

	const VkPipelineRasterizationStateCreateInfo rasterStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,     // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,                                                       // VkBool32                                 depthClampEnable;
		VK_FALSE,                                                       // VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,                                           // VkPolygonMode                            polygonMode;
		VK_CULL_MODE_NONE,                                              // VkCullModeFlags                          cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,                                // VkFrontFace                              frontFace;
		VK_FALSE,                                                       // VkBool32                                 depthBiasEnable;
		0.0f,                                                           // float                                    depthBiasConstantFactor;
		0.0f,                                                           // float                                    depthBiasClamp;
		0.0f,                                                           // float                                    depthBiasSlopeFactor;
		1.0f,                                                           // float                                    lineWidth;
	};

	const VkPipelineColorBlendAttachmentState colorBlendAttachmentState =
	{
		VK_FALSE,                                                                   // VkBool32                 blendEnable;
		VK_BLEND_FACTOR_ONE,                                                        // VkBlendFactor            srcColorBlendFactor;
		VK_BLEND_FACTOR_ZERO,                                                       // VkBlendFactor            dstColorBlendFactor;
		VK_BLEND_OP_ADD,                                                            // VkBlendOp                colorBlendOp;
		VK_BLEND_FACTOR_ONE,                                                        // VkBlendFactor            srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ZERO,                                                       // VkBlendFactor            dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,                                                            // VkBlendOp                alphaBlendOp;
		VK_COLOR_COMPONENT_R_BIT |
		VK_COLOR_COMPONENT_G_BIT |
		VK_COLOR_COMPONENT_B_BIT |
		VK_COLOR_COMPONENT_A_BIT                                                    // VkColorComponentFlags    colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo colorBlendStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,   // VkStructureType                              sType;
		DE_NULL,                                                    // const void*                                  pNext;
		0u,                                                         // VkPipelineColorBlendStateCreateFlags         flags;
		VK_FALSE,                                                   // VkBool32                                     logicOpEnable;
		VK_LOGIC_OP_COPY,                                           // VkLogicOp                                    logicOp;
		1u,                                                         // deUint32                                     attachmentCount;
		&colorBlendAttachmentState,                                 // const VkPipelineColorBlendAttachmentState*   pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },                                 // float                                        blendConst[4];
	};

	const VkPipelineMultisampleStateCreateInfo  multisampleStateParams  =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,   // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineMultisampleStateCreateFlags    flags;
		VK_SAMPLE_COUNT_1_BIT,                                      // VkSampleCountFlagBits                    rasterizationSamples;
		VK_FALSE,                                                   // VkBool32                                 sampleShadingEnable;
		0.0f,                                                       // float                                    minSampleShading;
		DE_NULL,                                                    // const VkSampleMask*                      pSampleMask;
		VK_FALSE,                                                   // VkBool32                                 alphaToCoverageEnable;
		VK_FALSE,                                                   // VkBool32                                 alphaToOneEnable;
	};

	VkPipelineDepthStencilStateCreateInfo depthStencilStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO, // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineDepthStencilStateCreateFlags   flags;
		VK_TRUE,                                                    // VkBool32                                 depthTestEnable;
		VK_TRUE,                                                    // VkBool32                                 depthWriteEnable;
		VK_COMPARE_OP_LESS_OR_EQUAL,                                // VkCompareOp                              depthCompareOp;
		VK_FALSE,                                                   // VkBool32                                 depthBoundsTestEnable;
		VK_FALSE,                                                   // VkBool32                                 stencilTestEnable;
		// VkStencilOpState front;
		{
			VK_STENCIL_OP_KEEP,     // VkStencilOp  failOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  passOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  depthFailOp;
			VK_COMPARE_OP_NEVER,    // VkCompareOp  compareOp;
			0u,                     // deUint32     compareMask;
			0u,                     // deUint32     writeMask;
			0u,                     // deUint32     reference;
		},
		// VkStencilOpState back;
		{
			VK_STENCIL_OP_KEEP,     // VkStencilOp  failOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  passOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  depthFailOp;
			VK_COMPARE_OP_NEVER,    // VkCompareOp  compareOp;
			0u,                     // deUint32     compareMask;
			0u,                     // deUint32     writeMask;
			0u,                     // deUint32     reference;
		},
		0.0f,                                                      // float                                    minDepthBounds;
		1.0f,                                                      // float                                    maxDepthBounds;
	};

	const VkPipelineTessellationStateCreateInfo tessStateCreateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,  // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineTesselationStateCreateFlags    flags;
		m_patchControlPoints,                                       // deUint32                                 patchControlPoints;
	};
	const VkPipelineTessellationStateCreateInfo* pTessCreateInfo = (m_patchControlPoints > 0)
																  ? &tessStateCreateInfo
																  : DE_NULL;

	const VkGraphicsPipelineCreateInfo graphicsPipelineParams =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,    // VkStructureType                                  sType;
		DE_NULL,                                            // const void*                                      pNext;
		0u,                                                 // VkPipelineCreateFlags                            flags;
		m_shaderStageCount,                                 // deUint32                                         stageCount;
		m_shaderStageInfo,                                  // const VkPipelineShaderStageCreateInfo*           pStages;
		&vertexInputStateParams,                            // const VkPipelineVertexInputStateCreateInfo*      pVertexInputState;
		&inputAssemblyStateParams,                          // const VkPipelineInputAssemblyStateCreateInfo*    pInputAssemblyState;
		pTessCreateInfo,                                    // const VkPipelineTessellationStateCreateInfo*     pTessellationState;
		&viewportStateParams,                               // const VkPipelineViewportStateCreateInfo*         pViewportState;
		&rasterStateParams,                                 // const VkPipelineRasterizationStateCreateInfo*    pRasterState;
		&multisampleStateParams,                            // const VkPipelineMultisampleStateCreateInfo*      pMultisampleState;
		&depthStencilStateParams,                           // const VkPipelineDepthStencilStateCreateInfo*     pDepthStencilState;
		&colorBlendStateParams,                             // const VkPipelineColorBlendStateCreateInfo*       pColorBlendState;
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,   // const VkPipelineDynamicStateCreateInfo*          pDynamicState;
		pipelineLayout,                                     // VkPipelineLayout                                 layout;
		renderPass,                                         // VkRenderPass                                     renderPass;
		0u,                                                 // deUint32                                         subpass;
		0u,                                                 // VkPipeline                                       basePipelineHandle;
		0,                                                  // deInt32                                          basePipelineIndex;
	};

	return createGraphicsPipeline(vk, vkDevice, cache, &graphicsPipelineParams);
}